

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O2

void printImm(MCInst *MI,SStream *O,int64_t imm,_Bool positive)

{
  uint8_t uVar1;
  int iVar2;
  _Bool _Var3;
  undefined3 in_register_00000009;
  char *fmt;
  uint64_t uVar4;
  
  iVar2 = MI->csh->syntax;
  if (CONCAT31(in_register_00000009,positive) == 0) {
    if (iVar2 == 4) {
      if (imm < 0) {
        uVar4 = -imm;
        if ((ulong)imm < 0xfffffffffffffff7) {
          _Var3 = need_zero_prefix(imm);
          if (_Var3) {
            fmt = "-0%lxh";
            imm = uVar4;
          }
          else {
            fmt = "-%lxh";
            imm = uVar4;
          }
        }
        else {
          fmt = "-%lu";
          imm = uVar4;
        }
        goto LAB_00222575;
      }
LAB_0022250a:
      if (9 < (ulong)imm) goto LAB_00222510;
    }
    else {
      if (imm < 0) {
        if ((ulong)imm < 0xfffffffffffffff7) {
          fmt = "-0x%lx";
          imm = -imm;
        }
        else {
          fmt = "-%lu";
          imm = -imm;
        }
        goto LAB_00222575;
      }
LAB_00222550:
      if (9 < (ulong)imm) goto LAB_00222556;
    }
    fmt = "%lu";
  }
  else {
    if (iVar2 != 4) {
      if (-1 < imm) goto LAB_00222550;
      uVar1 = MI->op1_size;
      if (uVar1 == '\x04') {
        imm = imm & 0xffffffff;
      }
      else if (uVar1 == '\x02') {
        imm = imm & 0xffff;
      }
      else if (uVar1 == '\x01') {
        imm = imm & 0xff;
      }
LAB_00222556:
      fmt = "0x%lx";
      goto LAB_00222575;
    }
    if (-1 < imm) goto LAB_0022250a;
    uVar1 = MI->op1_size;
    if (uVar1 == '\x04') {
      imm = imm & 0xffffffff;
    }
    else if (uVar1 == '\x02') {
      imm = imm & 0xffff;
    }
    else if (uVar1 == '\x01') {
      imm = imm & 0xff;
    }
LAB_00222510:
    _Var3 = need_zero_prefix(imm);
    if (_Var3) {
      fmt = "0%lxh";
    }
    else {
      fmt = "%lxh";
    }
  }
LAB_00222575:
  SStream_concat(O,fmt,imm);
  return;
}

Assistant:

static void printImm(MCInst *MI, SStream *O, int64_t imm, bool positive)
{
	if (positive) {
		// always print this number in positive form
		if (MI->csh->syntax == CS_OPT_SYNTAX_MASM) {
			if (imm < 0) {
				if (MI->op1_size) {
					switch(MI->op1_size) {
						default:
							break;
						case 1:
							imm &= 0xff;
							break;
						case 2:
							imm &= 0xffff;
							break;
						case 4:
							imm &= 0xffffffff;
							break;
					}
				}

				if (imm == 0x8000000000000000LL)  // imm == -imm
					SStream_concat0(O, "8000000000000000h");
				else if (need_zero_prefix(imm))
					SStream_concat(O, "0%"PRIx64"h", imm);
				else
					SStream_concat(O, "%"PRIx64"h", imm);
			} else {
				if (imm > HEX_THRESHOLD) {
					if (need_zero_prefix(imm))
						SStream_concat(O, "0%"PRIx64"h", imm);
					else
						SStream_concat(O, "%"PRIx64"h", imm);
				} else
					SStream_concat(O, "%"PRIu64, imm);
			}
		} else {	// Intel syntax
			if (imm < 0) {
				if (MI->op1_size) {
					switch(MI->op1_size) {
						default:
							break;
						case 1:
							imm &= 0xff;
							break;
						case 2:
							imm &= 0xffff;
							break;
						case 4:
							imm &= 0xffffffff;
							break;
					}
				}

				SStream_concat(O, "0x%"PRIx64, imm);
			} else {
				if (imm > HEX_THRESHOLD)
					SStream_concat(O, "0x%"PRIx64, imm);
				else
					SStream_concat(O, "%"PRIu64, imm);
			}
		}
	} else {
		if (MI->csh->syntax == CS_OPT_SYNTAX_MASM) {
			if (imm < 0) {
				if (imm == 0x8000000000000000LL)  // imm == -imm
					SStream_concat0(O, "8000000000000000h");
				else if (imm < -HEX_THRESHOLD) {
					if (need_zero_prefix(imm))
						SStream_concat(O, "-0%"PRIx64"h", -imm);
					else
						SStream_concat(O, "-%"PRIx64"h", -imm);
				} else
					SStream_concat(O, "-%"PRIu64, -imm);
			} else {
				if (imm > HEX_THRESHOLD) {
					if (need_zero_prefix(imm))
						SStream_concat(O, "0%"PRIx64"h", imm);
					else
						SStream_concat(O, "%"PRIx64"h", imm);
				} else
					SStream_concat(O, "%"PRIu64, imm);
			}
		} else {	// Intel syntax
			if (imm < 0) {
				if (imm == 0x8000000000000000LL)  // imm == -imm
					SStream_concat0(O, "0x8000000000000000");
				else if (imm < -HEX_THRESHOLD)
					SStream_concat(O, "-0x%"PRIx64, -imm);
				else
					SStream_concat(O, "-%"PRIu64, -imm);

			} else {
				if (imm > HEX_THRESHOLD)
					SStream_concat(O, "0x%"PRIx64, imm);
				else
					SStream_concat(O, "%"PRIu64, imm);
			}
		}
	}
}